

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

vector<crnlib::vec<3U,_int>_> * __thiscall
crnlib::vector<crnlib::vec<3U,_int>_>::operator=
          (vector<crnlib::vec<3U,_int>_> *this,vector<crnlib::vec<3U,_int>_> *other)

{
  vector<crnlib::vec<3U,_int>_> *in_RSI;
  vector<crnlib::vec<3U,_int>_> *in_RDI;
  undefined1 in_stack_ffffffffffffffda;
  undefined1 in_stack_ffffffffffffffdb;
  uint in_stack_ffffffffffffffdc;
  vector<crnlib::vec<3U,_int>_> *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    if (in_RDI->m_capacity < in_RSI->m_size) {
      clear(in_RDI);
      increase_capacity(in_RDI,in_stack_ffffffffffffffdc,(bool)in_stack_ffffffffffffffdb,
                        (bool)in_stack_ffffffffffffffda);
    }
    else {
      resize(in_RDI,(uint)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0));
    }
    memcpy(in_RDI->m_p,in_RSI->m_p,(ulong)in_RSI->m_size * 0xc);
    in_RDI->m_size = in_RSI->m_size;
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

inline vector& operator=(const vector& other) {
    if (this == &other)
      return *this;

    if (m_capacity >= other.m_size)
      resize(0);
    else {
      clear();
      increase_capacity(other.m_size, false);
    }

    if (CRNLIB_IS_BITWISE_COPYABLE(T))
      memcpy(m_p, other.m_p, other.m_size * sizeof(T));
    else {
      T* pDst = m_p;
      const T* pSrc = other.m_p;
      for (uint i = other.m_size; i > 0; i--)
        helpers::construct(pDst++, *pSrc++);
    }

    m_size = other.m_size;

    return *this;
  }